

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Generators_Stratified1D_Test::TestBody(Generators_Stratified1D_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  char *message;
  char *in_R9;
  int iVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  int count;
  AssertionResult gtest_ar_;
  int n;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  int local_74;
  Message local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  int local_5c;
  string local_58;
  AssertHelper local_38;
  
  local_74 = 0;
  local_5c = 0x80;
  puVar7 = &DAT_5851f42d4c957f2e;
  do {
    iVar6 = local_74 + 1;
    uVar4 = (uint)((ulong)puVar7 >> 0x2d) ^ (uint)((ulong)puVar7 >> 0x1b);
    bVar5 = (byte)((ulong)puVar7 >> 0x3b);
    auVar8._4_12_ = in_register_00001304;
    auVar8._0_4_ = in_XMM4_Da;
    auVar8 = vcvtusi2ss_avx512f(auVar8,uVar4 >> bVar5 | uVar4 << 0x20 - bVar5);
    auVar8 = vminss_avx(ZEXT416((uint)(auVar8._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar8 = ZEXT416((uint)((auVar8._0_4_ + (float)local_74) * 0.0078125));
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)((float)local_74 * 0.0078125)),auVar8,2);
    uVar2 = vcmpps_avx512vl(auVar8,ZEXT416((uint)((float)iVar6 * 0.0078125)),1);
    local_70.ss_.ptr_._0_1_ = (internal)((byte)uVar1 & (byte)uVar2 & 1);
    local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_70.ss_.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&local_70,
                 (AssertionResult *)
                 "u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                 ,0x46d,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (char)local_58._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
          &local_58.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p),
                        local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_80.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_80.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_80.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    puVar7 = (undefined1 *)((long)puVar7 * 0x5851f42d4c957f2d + 1);
    local_74 = iVar6;
  } while (iVar6 != 0x80);
  testing::internal::CmpHelperEQ<int,int>((internal *)&local_58,"n","count",&local_5c,&local_74);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_70);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x470,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_70.ss_.ptr_._1_7_,local_70.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Generators, Stratified1D) {
    int count = 0, n = 128;  // power of 2
    for (Float u : Stratified1D(n)) {
        EXPECT_TRUE(u >= Float(count) / Float(n) && u < Float(count + 1) / Float(n));
        ++count;
    }
    EXPECT_EQ(n, count);
}